

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O0

shared_ptr<gmlc::networking::AsioContextManager>
gmlc::networking::AsioContextManager::getContextPointer(string *contextName)

{
  bool bVar1;
  iterator this;
  string *contextName_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  element_type *in_RDI;
  shared_ptr<gmlc::networking::AsioContextManager> sVar3;
  iterator fnd;
  lock_guard<std::mutex> ctxlock;
  shared_ptr<gmlc::networking::AsioContextManager> *contextPtr;
  AsioContextManager *in_stack_ffffffffffffff58;
  shared_ptr<gmlc::networking::AsioContextManager> *in_stack_ffffffffffffff60;
  shared_ptr<gmlc::networking::AsioContextManager> *this_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
  *in_stack_ffffffffffffff70;
  shared_ptr<gmlc::networking::AsioContextManager> local_58;
  undefined4 local_44;
  _Self local_40;
  _Self local_38 [4];
  byte local_11;
  
  local_11 = 0;
  std::shared_ptr<gmlc::networking::AsioContextManager>::shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x7acae1);
  CLI::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff60,
             (mutex_type *)in_stack_ffffffffffffff58);
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
                 *)in_stack_ffffffffffffff58,(key_type *)0x7acb0b);
  local_38[0]._M_node = this._M_node;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
              *)in_stack_ffffffffffffff58);
  bVar1 = std::operator==(local_38,&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    contextName_00 = (string *)operator_new(0x98);
    AsioContextManager((AsioContextManager *)this._M_node,contextName_00);
    std::shared_ptr<gmlc::networking::AsioContextManager>::
    shared_ptr<gmlc::networking::AsioContextManager,void>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    this_00 = &local_58;
    std::shared_ptr<gmlc::networking::AsioContextManager>::operator=
              (this_00,(shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_ffffffffffffff58
              );
    CLI::std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
              ((shared_ptr<gmlc::networking::AsioContextManager> *)0x7acbf4);
    std::
    map<std::__cxx11::string,std::shared_ptr<gmlc::networking::AsioContextManager>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<gmlc::networking::AsioContextManager>>>>
    ::emplace<std::__cxx11::string_const&,std::shared_ptr<gmlc::networking::AsioContextManager>&>
              (in_stack_ffffffffffffff70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),this_00);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>
                  *)0x7acb4e);
    std::shared_ptr<gmlc::networking::AsioContextManager>::operator=
              (in_stack_ffffffffffffff60,
               (shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_ffffffffffffff58);
  }
  local_11 = 1;
  local_44 = 1;
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x7acc6b);
  _Var2._M_pi = extraout_RDX;
  if ((local_11 & 1) == 0) {
    CLI::std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
              ((shared_ptr<gmlc::networking::AsioContextManager> *)0x7acc90);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (shared_ptr<gmlc::networking::AsioContextManager>)
         sVar3.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AsioContextManager>
    AsioContextManager::getContextPointer(const std::string& contextName)
{
    std::shared_ptr<AsioContextManager> contextPtr;
    std::lock_guard<std::mutex> ctxlock(
        contextLock);  // just to ensure that nothing funny happens if you try
    // to get a context while it is being constructed
    auto fnd = contexts.find(contextName);
    if (fnd != contexts.end()) {
        contextPtr = fnd->second;
        return contextPtr;
    }

    contextPtr = std::shared_ptr<AsioContextManager>(
        new AsioContextManager(contextName));
    contexts.emplace(contextName, contextPtr);
    return contextPtr;
    // if it doesn't find it make a new one with the appropriate name
}